

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O0

bool btSolveDantzigLCP(int n,btScalar *A,btScalar *x,btScalar *b,btScalar *outer_w,int nub,
                      btScalar *lo,btScalar *hi,int *findex,btDantzigScratchMemory *scratchMem)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  float *_w;
  btLCP *this;
  btLCP *this_00;
  btAlignedObjectArray<float> *scratch;
  int *piVar6;
  btLCP *this_01;
  btAlignedObjectArray<float> *this_02;
  int *piVar7;
  float *pfVar8;
  bool *pbVar9;
  void *in_RCX;
  btLCP *in_RDX;
  btLCP *in_RSI;
  int in_EDI;
  btLCP *in_R8;
  int in_R9D;
  btScalar bVar10;
  btScalar bVar11;
  float fVar12;
  float fVar13;
  long in_stack_00000008;
  btScalar *in_stack_00000010;
  long in_stack_00000018;
  long in_stack_00000020;
  btScalar s2_4;
  btScalar s2_3;
  int indexC_k;
  int k_2;
  int numC;
  btScalar s2_2;
  int indexN_k;
  int k_1;
  int numN;
  btScalar s2_1;
  btScalar s2;
  btScalar s;
  int si;
  int cmd;
  btScalar dirf;
  int dir;
  btScalar wfk;
  int k;
  int j;
  int i;
  bool hit_first_friction_index;
  int adj_nub;
  btLCP lcp;
  btScalar *w;
  int nskip;
  int nskip_1;
  undefined8 in_stack_fffffffffffffd38;
  void *pvVar14;
  btScalar *in_stack_fffffffffffffd40;
  btLCP *this_03;
  btScalar *in_stack_fffffffffffffd48;
  float **in_stack_fffffffffffffd50;
  btScalar *_b;
  undefined8 in_stack_fffffffffffffd58;
  btAlignedObjectArray<float> *in_stack_fffffffffffffd60;
  undefined8 in_stack_fffffffffffffd80;
  btScalar *in_stack_fffffffffffffd88;
  btScalar *in_stack_fffffffffffffd90;
  int in_stack_fffffffffffffdac;
  btLCP *in_stack_fffffffffffffdb0;
  btLCP *in_stack_fffffffffffffdc8;
  float in_stack_fffffffffffffdd0;
  float in_stack_fffffffffffffdd4;
  btScalar *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  float in_stack_fffffffffffffde4;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  btScalar *in_stack_fffffffffffffe10;
  btLCP *this_04;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  int iVar15;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  int iVar16;
  undefined4 in_stack_fffffffffffffeb0;
  float fVar17;
  undefined4 in_stack_fffffffffffffeb4;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  int iVar18;
  undefined4 in_stack_fffffffffffffec4;
  undefined4 in_stack_fffffffffffffec8;
  uint uVar19;
  undefined4 in_stack_fffffffffffffecc;
  btLCP local_130;
  undefined1 local_99;
  undefined4 local_98;
  undefined4 local_94;
  undefined8 local_90;
  undefined4 local_88;
  undefined4 local_84;
  undefined4 local_80;
  undefined4 local_7c;
  btLCP *local_78;
  undefined4 local_6c;
  undefined4 local_68;
  int local_64;
  int local_5c;
  btLCP *local_58;
  void *local_50;
  btLCP *local_48;
  btLCP *local_40;
  int local_38;
  bool local_31;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffffd58 >> 0x20);
  s_error = false;
  local_50 = in_RCX;
  local_48 = in_RDX;
  local_38 = in_EDI;
  if (in_R9D < in_EDI) {
    local_68 = 0;
    local_64 = in_EDI;
    local_5c = in_R9D;
    local_58 = in_R8;
    local_40 = in_RSI;
    btAlignedObjectArray<float>::resize
              (in_stack_fffffffffffffd60,iVar2,(float *)in_stack_fffffffffffffd50);
    local_6c = 0;
    btAlignedObjectArray<float>::resize
              (in_stack_fffffffffffffd60,iVar2,(float *)in_stack_fffffffffffffd50);
    local_78 = local_58;
    local_7c = 0;
    btAlignedObjectArray<float>::resize
              (in_stack_fffffffffffffd60,iVar2,(float *)in_stack_fffffffffffffd50);
    local_80 = 0;
    btAlignedObjectArray<float>::resize
              (in_stack_fffffffffffffd60,iVar2,(float *)in_stack_fffffffffffffd50);
    local_84 = 0;
    btAlignedObjectArray<float>::resize
              (in_stack_fffffffffffffd60,iVar2,(float *)in_stack_fffffffffffffd50);
    local_88 = 0;
    btAlignedObjectArray<float>::resize
              (in_stack_fffffffffffffd60,iVar2,(float *)in_stack_fffffffffffffd50);
    local_90 = 0;
    btAlignedObjectArray<float_*>::resize
              ((btAlignedObjectArray<float_*> *)in_stack_fffffffffffffd60,iVar2,
               in_stack_fffffffffffffd50);
    local_94 = 0;
    btAlignedObjectArray<int>::resize
              ((btAlignedObjectArray<int> *)in_stack_fffffffffffffd60,iVar2,
               (int *)in_stack_fffffffffffffd50);
    local_98 = 0;
    btAlignedObjectArray<int>::resize
              ((btAlignedObjectArray<int> *)in_stack_fffffffffffffd60,iVar2,
               (int *)in_stack_fffffffffffffd50);
    local_99 = 0;
    btAlignedObjectArray<bool>::resize
              ((btAlignedObjectArray<bool> *)in_stack_fffffffffffffd60,iVar2,
               (bool *)in_stack_fffffffffffffd50);
    pvVar14 = local_50;
    this_03 = local_78;
    iVar2 = local_38;
    _b = in_stack_00000010;
    _w = btAlignedObjectArray<float>::operator[]
                   ((btAlignedObjectArray<float> *)(in_stack_00000020 + 0x20),0);
    this = (btLCP *)btAlignedObjectArray<float>::operator[]
                              ((btAlignedObjectArray<float> *)(in_stack_00000020 + 0x40),0);
    btAlignedObjectArray<float>::operator[]
              ((btAlignedObjectArray<float> *)(in_stack_00000020 + 0xa0),0);
    btAlignedObjectArray<float>::operator[]
              ((btAlignedObjectArray<float> *)(in_stack_00000020 + 0xc0),0);
    btAlignedObjectArray<float>::operator[]
              ((btAlignedObjectArray<float> *)(in_stack_00000020 + 0x60),0);
    this_00 = (btLCP *)btAlignedObjectArray<bool>::operator[]
                                 ((btAlignedObjectArray<bool> *)(in_stack_00000020 + 0x140),0);
    scratch = (btAlignedObjectArray<float> *)
              btAlignedObjectArray<int>::operator[]
                        ((btAlignedObjectArray<int> *)(in_stack_00000020 + 0x100),0);
    iVar5 = local_64;
    iVar3 = local_5c;
    this_04 = local_40;
    piVar6 = btAlignedObjectArray<int>::operator[]
                       ((btAlignedObjectArray<int> *)(in_stack_00000020 + 0x120),0);
    this_01 = (btLCP *)btAlignedObjectArray<float_*>::operator[]
                                 ((btAlignedObjectArray<float_*> *)(in_stack_00000020 + 0xe0),0);
    btLCP::btLCP(this_04,iVar3,iVar5,iVar2,in_stack_fffffffffffffe10,
                 (btScalar *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),_b,_w,
                 (btScalar *)this_01,
                 (btScalar *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                 (btScalar *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 (btScalar *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                 (btScalar *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                 (btScalar *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                 (btScalar *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                 (bool *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                 (int *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                 (int *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                 (int *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                 (btScalar **)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    iVar2 = btLCP::getNub(&local_130);
    uVar19 = 0;
    iVar5 = iVar2;
    for (; iVar2 < local_38; iVar2 = iVar2 + 1) {
      s_error = false;
      if ((((uVar19 & 0x1000000) == 0) && (in_stack_00000018 != 0)) &&
         (-1 < *(int *)(in_stack_00000018 + (long)iVar2 * 4))) {
        iVar3 = iVar2;
        for (iVar18 = 0; iVar2 = iVar3, iVar18 < local_38; iVar18 = iVar18 + 1) {
          fVar17 = (float)(&local_48->m_n)[iVar18];
          this_02 = (btAlignedObjectArray<float> *)(in_stack_00000020 + 0x60);
          piVar7 = btAlignedObjectArray<int>::operator[]
                             ((btAlignedObjectArray<int> *)(in_stack_00000020 + 0x100),iVar18);
          pfVar8 = btAlignedObjectArray<float>::operator[](this_02,*piVar7);
          *pfVar8 = fVar17;
        }
        for (; iVar3 < local_38; iVar3 = iVar3 + 1) {
          pfVar8 = btAlignedObjectArray<float>::operator[]
                             ((btAlignedObjectArray<float> *)(in_stack_00000020 + 0x60),
                              *(int *)(in_stack_00000018 + (long)iVar3 * 4));
          fVar17 = *pfVar8;
          if ((fVar17 != 0.0) || (NAN(fVar17))) {
            bVar10 = btFabs(in_stack_00000010[iVar3] * fVar17);
            in_stack_00000010[iVar3] = bVar10;
            *(float *)(in_stack_00000008 + (long)iVar3 * 4) = -in_stack_00000010[iVar3];
          }
          else {
            in_stack_00000010[iVar3] = 0.0;
            *(undefined4 *)(in_stack_00000008 + (long)iVar3 * 4) = 0;
          }
        }
        uVar19 = 0x1000000;
      }
      bVar10 = btLCP::AiC_times_qC(this_03,(int)((ulong)pvVar14 >> 0x20),(btScalar *)0x25cc5d);
      bVar11 = btLCP::AiN_times_qN(this_03,(int)((ulong)pvVar14 >> 0x20),(btScalar *)0x25cc82);
      (&local_78->m_n)[iVar2] =
           (int)((bVar10 + bVar11) - *(float *)((long)local_50 + (long)iVar2 * 4));
      if ((*(float *)(in_stack_00000008 + (long)iVar2 * 4) != 0.0) ||
         ((float)(&local_78->m_n)[iVar2] < 0.0)) {
        if ((in_stack_00000010[iVar2] != 0.0) || (0.0 < (float)(&local_78->m_n)[iVar2])) {
          if (((float)(&local_78->m_n)[iVar2] != 0.0) || (NAN((float)(&local_78->m_n)[iVar2]))) {
            do {
              if (0.0 < (float)(&local_78->m_n)[iVar2]) {
                iVar3 = -1;
                fVar17 = -1.0;
              }
              else {
                iVar3 = 1;
                fVar17 = 1.0;
              }
              btAlignedObjectArray<float>::operator[]
                        ((btAlignedObjectArray<float> *)(in_stack_00000020 + 0x80),0);
              btLCP::solve1((btLCP *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                            in_stack_fffffffffffffdd8,(int)in_stack_fffffffffffffdd4,
                            (int)in_stack_fffffffffffffdd0,
                            (int)((ulong)in_stack_fffffffffffffdc8 >> 0x20));
              btAlignedObjectArray<float>::operator[]
                        ((btAlignedObjectArray<float> *)(in_stack_00000020 + 0x60),0);
              btAlignedObjectArray<float>::operator[]
                        ((btAlignedObjectArray<float> *)(in_stack_00000020 + 0x80),0);
              btLCP::pN_equals_ANC_times_qC(this,_w,_b);
              pfVar8 = btAlignedObjectArray<float>::operator[]
                                 ((btAlignedObjectArray<float> *)(in_stack_00000020 + 0x60),0);
              btLCP::pN_plusequals_ANi(&local_130,pfVar8,iVar2,iVar3);
              btAlignedObjectArray<float>::operator[]
                        ((btAlignedObjectArray<float> *)(in_stack_00000020 + 0x80),0);
              bVar10 = btLCP::AiC_times_qC(this_03,(int)((ulong)pvVar14 >> 0x20),
                                           (btScalar *)0x25cf4c);
              bVar11 = btLCP::Aii(&local_130,iVar2);
              fVar12 = bVar11 * fVar17;
              pfVar8 = btAlignedObjectArray<float>::operator[]
                                 ((btAlignedObjectArray<float> *)(in_stack_00000020 + 0x60),iVar2);
              *pfVar8 = fVar12 + bVar10;
              iVar16 = 1;
              iVar18 = 0;
              fVar12 = -(float)(&local_78->m_n)[iVar2];
              pfVar8 = btAlignedObjectArray<float>::operator[]
                                 ((btAlignedObjectArray<float> *)(in_stack_00000020 + 0x60),iVar2);
              fVar12 = fVar12 / *pfVar8;
              if (iVar3 < 1) {
                if ((-(float)btInfinityMask.field_0 <
                     *(float *)(in_stack_00000008 + (long)iVar2 * 4)) &&
                   (fVar13 = (*(float *)(in_stack_00000008 + (long)iVar2 * 4) -
                             (float)(&local_48->m_n)[iVar2]) * fVar17, fVar13 < fVar12)) {
                  iVar16 = 2;
                  fVar12 = fVar13;
                }
              }
              else if ((in_stack_00000010[iVar2] < (float)btInfinityMask.field_0) &&
                      (fVar13 = (in_stack_00000010[iVar2] - (float)(&local_48->m_n)[iVar2]) * fVar17
                      , fVar13 < fVar12)) {
                iVar16 = 3;
                fVar12 = fVar13;
              }
              iVar4 = btLCP::numN(&local_130);
              iVar3 = iVar5;
              for (iVar15 = 0; iVar15 < iVar4; iVar15 = iVar15 + 1) {
                iVar5 = btLCP::indexN(&local_130,iVar15);
                pbVar9 = btAlignedObjectArray<bool>::operator[]
                                   ((btAlignedObjectArray<bool> *)(in_stack_00000020 + 0x140),iVar5)
                ;
                if ((*pbVar9 & 1U) == 0) {
                  pfVar8 = btAlignedObjectArray<float>::operator[]
                                     ((btAlignedObjectArray<float> *)(in_stack_00000020 + 0x60),
                                      iVar5);
                  if (*pfVar8 <= 0.0 && *pfVar8 != 0.0) {
LAB_0025d225:
                    if (((*(float *)(in_stack_00000008 + (long)iVar5 * 4) != 0.0) ||
                        (in_stack_00000010[iVar5] != 0.0)) || (NAN(in_stack_00000010[iVar5]))) {
                      fVar13 = (float)(&local_78->m_n)[iVar5];
                      pfVar8 = btAlignedObjectArray<float>::operator[]
                                         ((btAlignedObjectArray<float> *)(in_stack_00000020 + 0x60),
                                          iVar5);
                      fVar13 = -fVar13 / *pfVar8;
                      if (fVar13 < fVar12) {
                        iVar16 = 4;
                        fVar12 = fVar13;
                        iVar18 = iVar5;
                      }
                    }
                  }
                }
                else {
                  pfVar8 = btAlignedObjectArray<float>::operator[]
                                     ((btAlignedObjectArray<float> *)(in_stack_00000020 + 0x60),
                                      iVar5);
                  if (0.0 < *pfVar8) goto LAB_0025d225;
                }
              }
              iVar4 = btLCP::numC(&local_130);
              iVar5 = iVar3;
              for (; iVar3 < iVar4; iVar3 = iVar3 + 1) {
                iVar15 = btLCP::indexC(&local_130,iVar3);
                pfVar8 = btAlignedObjectArray<float>::operator[]
                                   ((btAlignedObjectArray<float> *)(in_stack_00000020 + 0x80),iVar15
                                   );
                if ((*pfVar8 <= 0.0 && *pfVar8 != 0.0) &&
                   (-(float)btInfinityMask.field_0 <
                    *(float *)(in_stack_00000008 + (long)iVar15 * 4))) {
                  fVar13 = *(float *)(in_stack_00000008 + (long)iVar15 * 4);
                  fVar1 = (float)(&local_48->m_n)[iVar15];
                  pfVar8 = btAlignedObjectArray<float>::operator[]
                                     ((btAlignedObjectArray<float> *)(in_stack_00000020 + 0x80),
                                      iVar15);
                  fVar13 = (fVar13 - fVar1) / *pfVar8;
                  if (fVar13 < fVar12) {
                    iVar16 = 5;
                    fVar12 = fVar13;
                    iVar18 = iVar15;
                  }
                }
                pfVar8 = btAlignedObjectArray<float>::operator[]
                                   ((btAlignedObjectArray<float> *)(in_stack_00000020 + 0x80),iVar15
                                   );
                if ((0.0 < *pfVar8) && (in_stack_00000010[iVar15] < (float)btInfinityMask.field_0))
                {
                  in_stack_fffffffffffffde4 =
                       in_stack_00000010[iVar15] - (float)(&local_48->m_n)[iVar15];
                  pfVar8 = btAlignedObjectArray<float>::operator[]
                                     ((btAlignedObjectArray<float> *)(in_stack_00000020 + 0x80),
                                      iVar15);
                  if (in_stack_fffffffffffffde4 / *pfVar8 < fVar12) {
                    iVar16 = 6;
                    fVar12 = in_stack_fffffffffffffde4 / *pfVar8;
                    iVar18 = iVar15;
                  }
                }
              }
              if (fVar12 <= 0.0) {
                if (iVar2 < local_38) {
                  btSetZero<float>((float *)(&local_48->m_n + iVar2),local_38 - iVar2);
                  btSetZero<float>((float *)(&local_78->m_n + iVar2),local_38 - iVar2);
                }
                s_error = true;
                break;
              }
              in_stack_fffffffffffffdb0 = local_48;
              in_stack_fffffffffffffdd0 = fVar12;
              pfVar8 = btAlignedObjectArray<float>::operator[]
                                 ((btAlignedObjectArray<float> *)(in_stack_00000020 + 0x80),0);
              btLCP::pC_plusequals_s_times_qC
                        (&local_130,(btScalar *)in_stack_fffffffffffffdb0,fVar12,pfVar8);
              (&local_48->m_n)[iVar2] =
                   (int)(in_stack_fffffffffffffdd0 * fVar17 + (float)(&local_48->m_n)[iVar2]);
              in_stack_fffffffffffffdc8 = local_78;
              in_stack_fffffffffffffdd4 = in_stack_fffffffffffffdd0;
              pfVar8 = btAlignedObjectArray<float>::operator[]
                                 ((btAlignedObjectArray<float> *)(in_stack_00000020 + 0x60),0);
              btLCP::pN_plusequals_s_times_qN
                        (&local_130,(btScalar *)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdd0,
                         pfVar8);
              pfVar8 = btAlignedObjectArray<float>::operator[]
                                 ((btAlignedObjectArray<float> *)(in_stack_00000020 + 0x60),iVar2);
              (&local_78->m_n)[iVar2] =
                   (int)(in_stack_fffffffffffffdd4 * *pfVar8 + (float)(&local_78->m_n)[iVar2]);
              in_stack_fffffffffffffdd8 = (btScalar *)(ulong)(iVar16 - 1);
              switch(in_stack_fffffffffffffdd8) {
              case (btScalar *)0x0:
                (&local_78->m_n)[iVar2] = 0;
                btLCP::transfer_i_to_C(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
                break;
              case (btScalar *)0x1:
                (&local_48->m_n)[iVar2] = (int)*(btScalar *)(in_stack_00000008 + (long)iVar2 * 4);
                pbVar9 = btAlignedObjectArray<bool>::operator[]
                                   ((btAlignedObjectArray<bool> *)(in_stack_00000020 + 0x140),iVar2)
                ;
                *pbVar9 = false;
                btLCP::transfer_i_to_N(&local_130,iVar2);
                break;
              case (btScalar *)0x2:
                (&local_48->m_n)[iVar2] = (int)in_stack_00000010[iVar2];
                pbVar9 = btAlignedObjectArray<bool>::operator[]
                                   ((btAlignedObjectArray<bool> *)(in_stack_00000020 + 0x140),iVar2)
                ;
                *pbVar9 = true;
                btLCP::transfer_i_to_N(&local_130,iVar2);
                break;
              case (btScalar *)0x3:
                (&local_78->m_n)[iVar18] = 0;
                btLCP::transfer_i_from_N_to_C
                          ((btLCP *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),0)
                ;
                break;
              case (btScalar *)0x4:
                (&local_48->m_n)[iVar18] = (int)*(btScalar *)(in_stack_00000008 + (long)iVar18 * 4);
                pbVar9 = btAlignedObjectArray<bool>::operator[]
                                   ((btAlignedObjectArray<bool> *)(in_stack_00000020 + 0x140),iVar18
                                   );
                *pbVar9 = false;
                btLCP::transfer_i_from_C_to_N(this_01,(int)((ulong)piVar6 >> 0x20),scratch);
                break;
              case (btScalar *)0x5:
                (&local_48->m_n)[iVar18] = (int)in_stack_00000010[iVar18];
                pbVar9 = btAlignedObjectArray<bool>::operator[]
                                   ((btAlignedObjectArray<bool> *)(in_stack_00000020 + 0x140),iVar18
                                   );
                *pbVar9 = true;
                btLCP::transfer_i_from_C_to_N(this_01,(int)((ulong)piVar6 >> 0x20),scratch);
              }
            } while (3 < iVar16);
          }
          else {
            btAlignedObjectArray<float>::operator[]
                      ((btAlignedObjectArray<float> *)(in_stack_00000020 + 0x80),0);
            btLCP::solve1((btLCP *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                          in_stack_fffffffffffffdd8,(int)in_stack_fffffffffffffdd4,
                          (int)in_stack_fffffffffffffdd0,
                          (int)((ulong)in_stack_fffffffffffffdc8 >> 0x20));
            btLCP::transfer_i_to_C(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
          }
        }
        else {
          btLCP::transfer_i_to_N(&local_130,iVar2);
          pbVar9 = btAlignedObjectArray<bool>::operator[]
                             ((btAlignedObjectArray<bool> *)(in_stack_00000020 + 0x140),iVar2);
          *pbVar9 = true;
        }
      }
      else {
        btLCP::transfer_i_to_N(&local_130,iVar2);
        pbVar9 = btAlignedObjectArray<bool>::operator[]
                           ((btAlignedObjectArray<bool> *)(in_stack_00000020 + 0x140),iVar2);
        *pbVar9 = false;
      }
      if ((s_error & 1U) != 0) break;
    }
    btLCP::unpermute(this_00);
  }
  else {
    btFactorLDLT(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                 (int)((ulong)in_stack_fffffffffffffd80 >> 0x20),(int)in_stack_fffffffffffffd80);
    btSolveLDLT((btScalar *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20),
                (int)in_stack_fffffffffffffd38);
    memcpy(local_48,local_50,(long)local_38 << 2);
  }
  local_31 = (bool)((s_error ^ 0xffU) & 1);
  return local_31;
}

Assistant:

bool btSolveDantzigLCP (int n, btScalar *A, btScalar *x, btScalar *b,
                btScalar* outer_w, int nub, btScalar *lo, btScalar *hi, int *findex, btDantzigScratchMemory& scratchMem)
{
	s_error = false;

//	printf("btSolveDantzigLCP n=%d\n",n);
  btAssert (n>0 && A && x && b && lo && hi && nub >= 0 && nub <= n);
  btAssert(outer_w);

#ifdef BT_DEBUG
  {
    // check restrictions on lo and hi
    for (int k=0; k<n; ++k) 
		btAssert (lo[k] <= 0 && hi[k] >= 0);
  }
# endif


  // if all the variables are unbounded then we can just factor, solve,
  // and return
  if (nub >= n) 
  {
   

    int nskip = (n);
    btFactorLDLT (A, outer_w, n, nskip);
    btSolveLDLT (A, outer_w, b, n, nskip);
    memcpy (x, b, n*sizeof(btScalar));

    return !s_error;
  }

  const int nskip = (n);
  scratchMem.L.resize(n*nskip);

  scratchMem.d.resize(n);

  btScalar *w = outer_w;
  scratchMem.delta_w.resize(n);
  scratchMem.delta_x.resize(n);
  scratchMem.Dell.resize(n);
  scratchMem.ell.resize(n);
  scratchMem.Arows.resize(n);
  scratchMem.p.resize(n);
  scratchMem.C.resize(n);

  // for i in N, state[i] is 0 if x(i)==lo(i) or 1 if x(i)==hi(i)
  scratchMem.state.resize(n);


  // create LCP object. note that tmp is set to delta_w to save space, this
  // optimization relies on knowledge of how tmp is used, so be careful!
  btLCP lcp(n,nskip,nub,A,x,b,w,lo,hi,&scratchMem.L[0],&scratchMem.d[0],&scratchMem.Dell[0],&scratchMem.ell[0],&scratchMem.delta_w[0],&scratchMem.state[0],findex,&scratchMem.p[0],&scratchMem.C[0],&scratchMem.Arows[0]);
  int adj_nub = lcp.getNub();

  // loop over all indexes adj_nub..n-1. for index i, if x(i),w(i) satisfy the
  // LCP conditions then i is added to the appropriate index set. otherwise
  // x(i),w(i) is driven either +ve or -ve to force it to the valid region.
  // as we drive x(i), x(C) is also adjusted to keep w(C) at zero.
  // while driving x(i) we maintain the LCP conditions on the other variables
  // 0..i-1. we do this by watching out for other x(i),w(i) values going
  // outside the valid region, and then switching them between index sets
  // when that happens.

  bool hit_first_friction_index = false;
  for (int i=adj_nub; i<n; ++i) 
  {
    s_error = false;
    // the index i is the driving index and indexes i+1..n-1 are "dont care",
    // i.e. when we make changes to the system those x's will be zero and we
    // don't care what happens to those w's. in other words, we only consider
    // an (i+1)*(i+1) sub-problem of A*x=b+w.

    // if we've hit the first friction index, we have to compute the lo and
    // hi values based on the values of x already computed. we have been
    // permuting the indexes, so the values stored in the findex vector are
    // no longer valid. thus we have to temporarily unpermute the x vector. 
    // for the purposes of this computation, 0*infinity = 0 ... so if the
    // contact constraint's normal force is 0, there should be no tangential
    // force applied.

    if (!hit_first_friction_index && findex && findex[i] >= 0) {
      // un-permute x into delta_w, which is not being used at the moment
      for (int j=0; j<n; ++j) scratchMem.delta_w[scratchMem.p[j]] = x[j];

      // set lo and hi values
      for (int k=i; k<n; ++k) {
        btScalar wfk = scratchMem.delta_w[findex[k]];
        if (wfk == 0) {
          hi[k] = 0;
          lo[k] = 0;
        }
        else {
          hi[k] = btFabs (hi[k] * wfk);
          lo[k] = -hi[k];
        }
      }
      hit_first_friction_index = true;
    }

    // thus far we have not even been computing the w values for indexes
    // greater than i, so compute w[i] now.
    w[i] = lcp.AiC_times_qC (i,x) + lcp.AiN_times_qN (i,x) - b[i];

    // if lo=hi=0 (which can happen for tangential friction when normals are
    // 0) then the index will be assigned to set N with some state. however,
    // set C's line has zero size, so the index will always remain in set N.
    // with the "normal" switching logic, if w changed sign then the index
    // would have to switch to set C and then back to set N with an inverted
    // state. this is pointless, and also computationally expensive. to
    // prevent this from happening, we use the rule that indexes with lo=hi=0
    // will never be checked for set changes. this means that the state for
    // these indexes may be incorrect, but that doesn't matter.

    // see if x(i),w(i) is in a valid region
    if (lo[i]==0 && w[i] >= 0) {
      lcp.transfer_i_to_N (i);
      scratchMem.state[i] = false;
    }
    else if (hi[i]==0 && w[i] <= 0) {
      lcp.transfer_i_to_N (i);
      scratchMem.state[i] = true;
    }
    else if (w[i]==0) {
      // this is a degenerate case. by the time we get to this test we know
      // that lo != 0, which means that lo < 0 as lo is not allowed to be +ve,
      // and similarly that hi > 0. this means that the line segment
      // corresponding to set C is at least finite in extent, and we are on it.
      // NOTE: we must call lcp.solve1() before lcp.transfer_i_to_C()
      lcp.solve1 (&scratchMem.delta_x[0],i,0,1);

      lcp.transfer_i_to_C (i);
    }
    else {
      // we must push x(i) and w(i)
      for (;;) {
        int dir;
        btScalar dirf;
        // find direction to push on x(i)
        if (w[i] <= 0) {
          dir = 1;
          dirf = btScalar(1.0);
        }
        else {
          dir = -1;
          dirf = btScalar(-1.0);
        }

        // compute: delta_x(C) = -dir*A(C,C)\A(C,i)
        lcp.solve1 (&scratchMem.delta_x[0],i,dir);

        // note that delta_x[i] = dirf, but we wont bother to set it

        // compute: delta_w = A*delta_x ... note we only care about
        // delta_w(N) and delta_w(i), the rest is ignored
        lcp.pN_equals_ANC_times_qC (&scratchMem.delta_w[0],&scratchMem.delta_x[0]);
        lcp.pN_plusequals_ANi (&scratchMem.delta_w[0],i,dir);
        scratchMem.delta_w[i] = lcp.AiC_times_qC (i,&scratchMem.delta_x[0]) + lcp.Aii(i)*dirf;

        // find largest step we can take (size=s), either to drive x(i),w(i)
        // to the valid LCP region or to drive an already-valid variable
        // outside the valid region.

        int cmd = 1;		// index switching command
        int si = 0;		// si = index to switch if cmd>3
        btScalar s = -w[i]/scratchMem.delta_w[i];
        if (dir > 0) {
          if (hi[i] < BT_INFINITY) {
            btScalar s2 = (hi[i]-x[i])*dirf;	// was (hi[i]-x[i])/dirf	// step to x(i)=hi(i)
            if (s2 < s) {
              s = s2;
              cmd = 3;
            }
          }
        }
        else {
          if (lo[i] > -BT_INFINITY) {
            btScalar s2 = (lo[i]-x[i])*dirf;	// was (lo[i]-x[i])/dirf	// step to x(i)=lo(i)
            if (s2 < s) {
              s = s2;
              cmd = 2;
            }
          }
        }

        {
          const int numN = lcp.numN();
          for (int k=0; k < numN; ++k) {
            const int indexN_k = lcp.indexN(k);
            if (!scratchMem.state[indexN_k] ? scratchMem.delta_w[indexN_k] < 0 : scratchMem.delta_w[indexN_k] > 0) {
                // don't bother checking if lo=hi=0
                if (lo[indexN_k] == 0 && hi[indexN_k] == 0) continue;
                btScalar s2 = -w[indexN_k] / scratchMem.delta_w[indexN_k];
                if (s2 < s) {
                  s = s2;
                  cmd = 4;
                  si = indexN_k;
                }
            }
          }
        }

        {
          const int numC = lcp.numC();
          for (int k=adj_nub; k < numC; ++k) {
            const int indexC_k = lcp.indexC(k);
            if (scratchMem.delta_x[indexC_k] < 0 && lo[indexC_k] > -BT_INFINITY) {
              btScalar s2 = (lo[indexC_k]-x[indexC_k]) / scratchMem.delta_x[indexC_k];
              if (s2 < s) {
                s = s2;
                cmd = 5;
                si = indexC_k;
              }
            }
            if (scratchMem.delta_x[indexC_k] > 0 && hi[indexC_k] < BT_INFINITY) {
              btScalar s2 = (hi[indexC_k]-x[indexC_k]) / scratchMem.delta_x[indexC_k];
              if (s2 < s) {
                s = s2;
                cmd = 6;
                si = indexC_k;
              }
            }
          }
        }

        //static char* cmdstring[8] = {0,"->C","->NL","->NH","N->C",
        //			     "C->NL","C->NH"};
        //printf ("cmd=%d (%s), si=%d\n",cmd,cmdstring[cmd],(cmd>3) ? si : i);

        // if s <= 0 then we've got a problem. if we just keep going then
        // we're going to get stuck in an infinite loop. instead, just cross
        // our fingers and exit with the current solution.
        if (s <= btScalar(0.0)) 
		{
//          printf("LCP internal error, s <= 0 (s=%.4e)",(double)s);
          if (i < n) {
            btSetZero (x+i,n-i);
            btSetZero (w+i,n-i);
          }
          s_error = true;
          break;
        }

        // apply x = x + s * delta_x
        lcp.pC_plusequals_s_times_qC (x, s, &scratchMem.delta_x[0]);
        x[i] += s * dirf;

        // apply w = w + s * delta_w
        lcp.pN_plusequals_s_times_qN (w, s, &scratchMem.delta_w[0]);
        w[i] += s * scratchMem.delta_w[i];

//        void *tmpbuf;
        // switch indexes between sets if necessary
        switch (cmd) {
        case 1:		// done
          w[i] = 0;
          lcp.transfer_i_to_C (i);
          break;
        case 2:		// done
          x[i] = lo[i];
          scratchMem.state[i] = false;
          lcp.transfer_i_to_N (i);
          break;
        case 3:		// done
          x[i] = hi[i];
          scratchMem.state[i] = true;
          lcp.transfer_i_to_N (i);
          break;
        case 4:		// keep going
          w[si] = 0;
          lcp.transfer_i_from_N_to_C (si);
          break;
        case 5:		// keep going
          x[si] = lo[si];
          scratchMem.state[si] = false;
		  lcp.transfer_i_from_C_to_N (si, scratchMem.m_scratch);
          break;
        case 6:		// keep going
          x[si] = hi[si];
          scratchMem.state[si] = true;
          lcp.transfer_i_from_C_to_N (si, scratchMem.m_scratch);
          break;
        }

        if (cmd <= 3) break;
      } // for (;;)
    } // else

    if (s_error) 
	{
      break;
    }
  } // for (int i=adj_nub; i<n; ++i)

  lcp.unpermute();


  return !s_error;
}